

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SColor.h
# Opt level: O2

u16 irr::video::A8R8G8B8toA1R5G5B5(u32 color)

{
  return (ushort)(color >> 6) & 0x3e0 |
         (ushort)(color >> 9) & 0x7c00 | (ushort)(color >> 0x10) & 0x8000 |
         (ushort)(color >> 3) & 0x1f;
}

Assistant:

inline u16 A8R8G8B8toA1R5G5B5(u32 color)
{
	return (u16)((color & 0x80000000) >> 16 |
				 (color & 0x00F80000) >> 9 |
				 (color & 0x0000F800) >> 6 |
				 (color & 0x000000F8) >> 3);
}